

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

int __thiscall crnlib::dynamic_string::tolower(dynamic_string *this,int __c)

{
  char *p;
  
  if (this->m_len != 0) {
    p = "";
    if (this->m_pStr != (char *)0x0) {
      p = this->m_pStr;
    }
    strlwr(p);
  }
  return (int)this;
}

Assistant:

dynamic_string& dynamic_string::tolower()
    {
        if (m_len)
        {
#if defined(CRN_CC_MSVC)
            _strlwr_s(get_ptr_priv(), m_buf_size);
#else
            strlwr(get_ptr_priv());
#endif
        }
        return *this;
    }